

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type sVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  long lVar16;
  int64_t iVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  bool bVar18;
  pair<long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar19;
  pair<unsigned_long,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar20;
  ArgIterator __begin1;
  string srcFilename;
  string crcspec;
  string dstFilename;
  uint local_fc;
  ArgIterator local_f0;
  uint local_c8;
  uint local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  int local_9c;
  int64_t local_98;
  undefined8 local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int64_t local_68;
  int64_t local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int64_t local_38;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_f0.i = 1;
  local_f0.longmatch = false;
  local_f0.isoption = false;
  if (argc == 1) {
    local_f0.p = (char *)0x0;
    local_f0.pend = (char *)0x0;
  }
  else {
    local_f0.p = argv[1];
    if (*local_f0.p == '\0') {
      lVar8 = 0;
    }
    else {
      lVar10 = 0;
      do {
        lVar8 = lVar10 + 1;
        lVar9 = lVar10 + 1;
        lVar10 = lVar8;
      } while (local_f0.p[lVar9] != '\0');
    }
    local_f0.pend = local_f0.p + lVar8;
  }
  bVar11 = local_f0.p != (char *)0x0 || argc != 1;
  iVar5 = 1;
  local_f0.argv = argv;
  local_f0.argc = argc;
  local_9c = argc;
  if (local_f0.p != (char *)0x0 || argc != 1) {
    local_90 = 0;
    iVar2 = 0;
    local_fc = 0;
    bVar3 = false;
    local_c4 = 0;
    local_c8 = 0;
    do {
      iVar4 = ArgParser::ArgIterator::option(&local_f0);
      switch(iVar4) {
      case 0x61:
        g_dumpformat = DUMP_STRINGS;
        break;
      case 0x62:
        local_38 = ArgParser::ArgIterator::getint(&local_f0);
        local_c8 = (uint)CONCAT71((int7)((ulong)local_38 >> 8),1);
        break;
      case 99:
        bVar18 = ArgParser::ArgIterator::match(&local_f0,"-crc");
        if (!bVar18) {
          g_dumpformat = DUMP_RAW;
          break;
        }
        g_dumpformat = DUMP_CRC32;
        pcVar15 = ArgParser::ArgIterator::getstr(&local_f0);
        sVar1 = local_88._M_string_length;
        sVar7 = strlen(pcVar15);
        bVar18 = true;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_88,0,sVar1,pcVar15,sVar7);
        goto LAB_00105bb9;
      case 100:
      case 0x67:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6e:
      case 0x70:
      case 0x71:
      case 0x74:
      case 0x75:
      case 0x76:
switchD_001057de_caseD_64:
        usage();
        local_90 = 1;
        bVar18 = false;
        goto LAB_00105bb9;
      case 0x65:
        local_98 = ArgParser::ArgIterator::getint(&local_f0);
        bVar3 = true;
        break;
      case 0x66:
        g_fulldump = true;
        break;
      case 0x68:
        g_dumpformat = DUMP_HASHES;
        break;
      case 0x6c:
        local_60 = ArgParser::ArgIterator::getint(&local_f0);
        local_c4 = (uint)CONCAT71((int7)((ulong)local_60 >> 8),1);
        break;
      case 0x6d:
        bVar18 = ArgParser::ArgIterator::match(&local_f0,"-md5");
        if (bVar18) {
          g_dumpformat = DUMP_HASH;
          g_hashtype = 1;
        }
        else {
          bVar18 = ArgParser::ArgIterator::match(&local_f0,"-md4");
          if (bVar18) {
            g_dumpformat = DUMP_HASH;
            g_hashtype = 0;
          }
          else {
            bVar18 = ArgParser::ArgIterator::match(&local_f0,"-md160");
            if (bVar18) goto LAB_001059e6;
          }
        }
        break;
      case 0x6f:
        local_68 = ArgParser::ArgIterator::getint(&local_f0);
        local_fc = 1;
        break;
      case 0x72:
        bVar18 = ArgParser::ArgIterator::match(&local_f0,"-ripemd160");
        if (bVar18) {
LAB_001059e6:
          g_dumpformat = DUMP_HASH;
          g_hashtype = 6;
        }
        else {
          uVar6 = ArgParser::ArgIterator::getuint(&local_f0);
          g_chunksize = (uint32_t)uVar6;
        }
        break;
      case 0x73:
        bVar18 = ArgParser::ArgIterator::match(&local_f0,"-sha256");
        if (bVar18) {
          g_dumpformat = DUMP_HASH;
          g_hashtype = 3;
        }
        else {
          bVar18 = ArgParser::ArgIterator::match(&local_f0,"-sha384");
          if (bVar18) {
            g_dumpformat = DUMP_HASH;
            g_hashtype = 4;
          }
          else {
            bVar18 = ArgParser::ArgIterator::match(&local_f0,"-sha512");
            if (bVar18) {
              g_dumpformat = DUMP_HASH;
              g_hashtype = 5;
            }
            else {
              bVar18 = ArgParser::ArgIterator::match(&local_f0,"-sum");
              if (bVar18) {
                g_dumpformat = DUMP_SUM;
              }
              else {
                g_llStepSize = ArgParser::ArgIterator::getint(&local_f0);
              }
            }
          }
        }
        break;
      case 0x77:
        iVar17 = ArgParser::ArgIterator::getint(&local_f0);
        g_nMaxUnitsPerLine = (int)iVar17;
        break;
      case 0x78:
        iVar4 = ArgParser::ArgIterator::count(&local_f0);
        if (iVar4 == 2) {
          g_dumpformat = DUMP_ASCII;
        }
        else {
          g_dumpformat = DUMP_HEX;
        }
        break;
      default:
        uVar12 = iVar4 - 0x31;
        if (0x22 < uVar12) {
LAB_00105831:
          if (iVar4 + 1U < 2) {
            iVar4 = iVar2 + 1;
            if (iVar2 == 1) {
              pcVar15 = ArgParser::ArgIterator::getstr(&local_f0);
              this = &local_58;
            }
            else {
              bVar18 = iVar2 != 0;
              iVar2 = iVar4;
              if (bVar18) break;
              pcVar15 = ArgParser::ArgIterator::getstr(&local_f0);
              this = &local_c0;
            }
            sVar1 = this->_M_string_length;
            sVar7 = strlen(pcVar15);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(this,0,sVar1,pcVar15,sVar7);
            bVar18 = true;
            iVar2 = iVar4;
            goto LAB_00105bb9;
          }
          goto switchD_001057de_caseD_64;
        }
        if ((0x8bUL >> ((ulong)uVar12 & 0x3f) & 1) == 0) {
          if ((ulong)uVar12 != 0x22) goto LAB_00105831;
          uVar6 = ArgParser::ArgIterator::getuint(&local_f0);
          g_summarizeThreshold = (int)uVar6;
        }
        else {
          iVar5 = ArgParser::ArgIterator::option(&local_f0);
          iVar5 = iVar5 + -0x30;
        }
      }
      bVar18 = true;
LAB_00105bb9:
      if (!bVar18) break;
      lVar8 = (long)local_f0.i;
      if (local_f0.i != local_f0.argc) {
        local_f0.i = local_f0.i + 1;
        local_f0.longmatch = false;
        local_f0.isoption = false;
        if (local_f0.i == local_f0.argc) {
          local_f0.p = (char *)0x0;
          local_f0.pend = (char *)0x0;
        }
        else {
          local_f0.p = local_f0.argv[lVar8 + 1];
          if (*local_f0.p == '\0') {
            lVar8 = 0;
          }
          else {
            lVar10 = 0;
            do {
              lVar8 = lVar10 + 1;
              lVar9 = lVar10 + 1;
              lVar10 = lVar8;
            } while (local_f0.p[lVar9] != '\0');
          }
          local_f0.pend = local_f0.p + lVar8;
        }
      }
      bVar11 = local_f0.p != (char *)0x0 || local_f0.i != local_9c;
    } while (bVar11);
  }
  else {
    local_c8 = 0;
    local_c4 = 0;
    bVar3 = false;
    local_fc = 0;
    iVar2 = 0;
    local_90 = 0;
  }
  uVar12 = local_c4;
  iVar4 = (int)local_90;
  if (bVar11) goto LAB_00105f77;
  if (iVar2 == 0 || 2 < iVar2) {
    usage();
  }
  else {
    if (local_88._M_string_length != 0) {
      pVar19 = parsesigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_88._M_dataplus._M_p,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )(local_88._M_dataplus._M_p + local_88._M_string_length),0);
      g_crc_initval = pVar19.first;
      if (pVar19.second._M_current._M_current !=
          local_88._M_dataplus._M_p + local_88._M_string_length) {
        pVar20 = parseunsigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(pVar19.second._M_current._M_current + 1),
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(local_88._M_dataplus._M_p + local_88._M_string_length),0);
        g_crc_poly = pVar20.first;
        if (pVar20.second._M_current._M_current !=
            local_88._M_dataplus._M_p + local_88._M_string_length) {
          pVar20 = parseunsigned<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(pVar20.second._M_current._M_current + 1),
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(local_88._M_dataplus._M_p + local_88._M_string_length),0);
          g_crc_bits = pVar20.first;
        }
      }
    }
    if (g_nMaxUnitsPerLine < 0) {
      if (g_dumpformat == DUMP_HEX) {
        lVar8 = 0x20;
      }
      else if (g_dumpformat == DUMP_ASCII) {
        lVar8 = 0x40;
      }
      else {
        if (4 < (int)g_dumpformat) {
          g_nMaxUnitsPerLine = (int)g_llStepSize;
          goto LAB_00105d5c;
        }
        lVar8 = 0x10;
      }
      g_nMaxUnitsPerLine = (int)(lVar8 / (long)iVar5);
    }
LAB_00105d5c:
    if (iVar5 == 1) {
      g_dumpunit = DUMPUNIT_BYTE;
    }
    else if (iVar5 == 2) {
      g_dumpunit = DUMPUNIT_WORD;
    }
    else if (iVar5 == 4) {
      g_dumpunit = DUMPUNIT_DWORD;
    }
    else {
      g_dumpunit = (uint)(iVar5 == 8) * 3;
    }
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_c0,"-");
    if (iVar5 == 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = GetFileSize(&local_c0);
    }
    bVar11 = (local_c8 & 1) != 0;
    lVar10 = 0;
    if (bVar11) {
      lVar10 = local_38;
    }
    uVar13 = 1;
    if (bVar11) {
      uVar13 = local_c8 & 0xff;
    }
    lVar9 = lVar10;
    uVar14 = uVar13;
    if ((local_fc == 0) || (lVar9 = local_68, uVar14 = local_fc, -1 < local_68)) {
LAB_00105e2c:
      iVar17 = local_60;
      if ((uVar12 & 1) == 0) {
        if (bVar3) {
          if ((uVar12 & 1) != 0) goto LAB_00105e32;
          if (bVar3) {
            lVar16 = local_98;
            if (local_98 < 0) {
              if (iVar5 == 0 || lVar8 < 0) {
                pcVar15 = "Can\'t use negative offsets, on stdin";
                goto LAB_00105f6c;
              }
              bVar3 = true;
              lVar16 = local_98 + lVar8;
            }
            if ((!bVar3) || ((uVar14 & 1) == 0)) {
              std::__throw_bad_optional_access();
            }
            iVar17 = lVar16 - lVar9;
            uVar12 = 1;
            goto LAB_00105f4c;
          }
          if ((uVar12 & 1) != 0) goto LAB_00105e32;
          goto LAB_00105e39;
        }
        uVar12 = 1;
        if (lVar8 < 0) {
          iVar17 = 0x7fffffffffffffff;
        }
        else {
          if ((uVar13 & 1) == 0) {
            std::__throw_bad_optional_access();
          }
          if ((uVar14 & 1) == 0) {
            std::__throw_bad_optional_access();
          }
          iVar17 = (lVar8 + lVar10) - lVar9;
        }
LAB_00105f4c:
        if (((uVar14 & 1) == 0) || ((uVar13 & 1) == 0)) goto LAB_0010606e;
        if (lVar10 <= lVar9) {
          if (local_58._M_string_length == 0) {
            if (g_llStepSize == 0) {
              if ((uVar12 & 1) == 0) goto LAB_0010606e;
              Dumpfile(&local_c0,lVar10,lVar9,iVar17);
            }
            else {
              if ((uVar12 & 1) == 0) goto LAB_0010606e;
              StepFile(&local_c0,lVar10,lVar9,iVar17);
            }
          }
          else if (g_llStepSize == 0) {
            if ((uVar12 & 1) == 0) goto LAB_0010606e;
            Copyfile(&local_c0,&local_58,lVar10,lVar9,iVar17);
          }
          else {
            if ((uVar12 & 1) == 0) {
LAB_0010606e:
              std::__throw_bad_optional_access();
            }
            CopyFileSteps(&local_c0,&local_58,lVar10,lVar9,iVar17);
          }
          iVar4 = 0;
          goto LAB_00105f77;
        }
        pcVar15 = "offset must be >= baseoffset";
      }
      else {
LAB_00105e32:
        if (bVar3) {
LAB_00105e39:
          if (((byte)uVar14 & (byte)uVar12 & 1) == 0) {
            std::__throw_bad_optional_access();
          }
          if ((bVar3) && (local_98 == lVar9 + local_60)) goto LAB_00105f4c;
          pcVar15 = "inconsistent use of -l, -o and -e";
        }
        else {
          if (-1 < local_60) {
            if ((uVar14 & 1) == 0) {
              std::__throw_bad_optional_access();
            }
            goto LAB_00105f4c;
          }
          pcVar15 = "Can\'t use negative length";
        }
      }
    }
    else {
      if (iVar5 != 0 && -1 < lVar8) {
        if ((uVar13 & 1) == 0) {
          std::__throw_bad_optional_access();
        }
        lVar9 = local_68 + lVar10 + lVar8;
        uVar14 = 1;
        goto LAB_00105e2c;
      }
      pcVar15 = "dumping end of stdin stream not yet implemented";
    }
LAB_00105f6c:
    puts(pcVar15);
  }
  iVar4 = 1;
LAB_00105f77:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
    std::optional<int64_t> llOffset;
    std::optional<int64_t> llEndOffset;
    std::optional<int64_t> llLength;
    std::optional<int64_t> llBaseOffset;

    std::string srcFilename;
    std::string dstFilename;
    int nDumpUnitSize = 1;
    std::string crcspec;

    int argsfound = 0; 

    for (auto& arg : ArgParser(argc, argv))
        switch(arg.option())
        {
            case 'b': llBaseOffset = arg.getint(); break;
            case 'o': llOffset = arg.getint(); break;
            case 'e': llEndOffset = arg.getint(); break;
            case 'l': llLength = arg.getint(); break;

            case 'h': g_dumpformat= DUMP_HASHES; break;
            case 'r': 
#if !defined(__ANDROID__)
#ifdef RIPEMD160_DIGEST_LENGTH
                      if (arg.match("-ripemd160")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::RIPEMD160;
                      }
                      else
#endif
#endif
 
                      g_chunksize = arg.getuint(); break;

            case 'w': g_nMaxUnitsPerLine = arg.getint(); break;
            case 's': if (0)
                          ;
#ifdef SHA1_DIGEST_LENGTH
                      else if (arg.match("-sha1")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA1;
                      }
#endif
#if !defined(__ANDROID__)
#ifdef SHA256_DIGEST_LENGTH
                      else if (arg.match("-sha256")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA256;
                      }
#endif
#ifdef SHA384_DIGEST_LENGTH
                      else if (arg.match("-sha384")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA384;
                      }
#endif
#ifdef SHA512_DIGEST_LENGTH
                      else if (arg.match("-sha512")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::SHA512;
                      }
#endif
#endif

                      else if (arg.match("-sum"))
                          g_dumpformat= DUMP_SUM;
                      else
                          g_llStepSize = arg.getint();
                      break;
            case 'm': if (0)
                          ;
#ifdef MD5_DIGEST_LENGTH
                      else if (arg.match("-md5")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD5;
                      }
#endif
#ifdef MD2_DIGEST_LENGTH
                      else if (arg.match("-md2")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD2;
                      }
#endif
#ifdef MD4_DIGEST_LENGTH
                      else if (arg.match("-md4")) {
                          g_dumpformat= DUMP_HASH; 
                          g_hashtype= CryptHash::MD4;
                      }
#endif
#if !defined(__ANDROID__)
#ifdef RIPEMD160_DIGEST_LENGTH
                      else if (arg.match("-md160")) {
                          g_dumpformat= DUMP_HASH;
                          g_hashtype= CryptHash::RIPEMD160;
                      }
#endif
#endif

                      break;
            case 'a': g_dumpformat= DUMP_STRINGS; break;
            case 'c': if (arg.match("-crc")) {
                          g_dumpformat= DUMP_CRC32; 
                          crcspec = arg.getstr();
                      }
                      else
                          g_dumpformat= DUMP_RAW; 
                      break;
            case 'f': g_fulldump= true; break;
            case 'S': g_summarizeThreshold = arg.getuint(); break;
            case 'x': if (arg.count()==2)
                          g_dumpformat= DUMP_ASCII; 
                      else
                          g_dumpformat= DUMP_HEX; 
                      break;
            case '1': case '2': case '4': case '8':
                nDumpUnitSize= arg.option()-'0';
                break;
            case 0: // single '-'
            case -1:
                switch (argsfound++) {
                    case 0: srcFilename= arg.getstr(); break;
                    case 1: dstFilename= arg.getstr(); break;
                }
                break;

            default:
                usage();
                return 1;
        }
    if (argsfound==0 || argsfound>2)
    {
        usage();
        return 1;
    }

    if (!crcspec.empty()) {
        auto res1 = parsesigned(crcspec.begin(), crcspec.end(), 0);
        g_crc_initval= res1.first;
        if (res1.second!=crcspec.end()) {
            auto res2 = parseunsigned(res1.second+1, crcspec.end(), 0);
            g_crc_poly= res2.first;
            if (res2.second!=crcspec.end()) {
                auto res3 = parseunsigned(res2.second+1, crcspec.end(), 0);
                g_crc_bits= res3.first;

            }
        }
    }

    // 64 = highest 2^n, such that addrsize + 2^n <= screenwidth
    // 32 = highest 2^n, such that addrsize + 3*2^n <= screenwidth+25 ...
    // 16 = highest 2^n, such that addrsize + 4*2^n <= screenwidth
    if (g_nMaxUnitsPerLine<0) {
        if (g_dumpformat==DUMP_ASCII) 
            g_nMaxUnitsPerLine= 64/nDumpUnitSize;
        else if (g_dumpformat==DUMP_HEX) 
            g_nMaxUnitsPerLine= 32/nDumpUnitSize;
        else if (g_dumpformat>=DUMP_HASH)
            g_nMaxUnitsPerLine= g_llStepSize;
        else
            g_nMaxUnitsPerLine= 16/nDumpUnitSize;
    }

    g_dumpunit= 
        nDumpUnitSize==1?DUMPUNIT_BYTE:
        nDumpUnitSize==2?DUMPUNIT_WORD:
        nDumpUnitSize==4?DUMPUNIT_DWORD:
        nDumpUnitSize==8?DUMPUNIT_QWORD:DUMPUNIT_BYTE;

    if (g_dumpformat==DUMP_RAW) {
#ifdef WIN32
        if (-1==_setmode( _fileno( stdout ), _O_BINARY )) {
            print("ERROR: _setmode(stdout, rb)");
            return 1;
        }
#endif
    }

    bool fromStdin= srcFilename=="-";

    int64_t llFileSize= fromStdin ? -1 : GetFileSize(srcFilename);

    if (!llBaseOffset)
        llBaseOffset = 0;

    // determine start
    if (!llOffset)
        llOffset = llBaseOffset;
    else if (llOffset.value() < 0) {
        if (fromStdin || llFileSize < 0) {
            printf("dumping end of stdin stream not yet implemented\n");
            return 1;
        }
        llOffset = llBaseOffset.value() + llOffset.value() + llFileSize;
    }

    // determine end
    if (!llLength && !llEndOffset)
    {
        if (llFileSize >= 0) {
            llEndOffset = llBaseOffset.value() + llFileSize;
            llLength = llEndOffset.value() - llOffset.value();
        }
        // else: filesize, length unknown - until EOF.
        else {
            llEndOffset = INT64_MAX;
            llLength = INT64_MAX;
        }
    }
    else if (!llLength && llEndOffset) {
        if (llEndOffset < 0) {
            if (fromStdin || llFileSize < 0) {
                printf("Can't use negative offsets, on stdin\n");
                return 1;
            }
            llEndOffset = llEndOffset.value() + llFileSize;
        }
        llLength = llEndOffset.value() - llOffset.value();
    }
    else if (llLength && !llEndOffset) {
        if (llLength < 0) {
            printf("Can't use negative length\n");
            return 1;
        }
        llEndOffset = llOffset.value() + llLength.value();
    }
    else {
        if (llEndOffset != llOffset.value() + llLength.value()) {
            printf("inconsistent use of -l, -o and -e\n");
            return 1;
        }
    }

    if (llOffset.value() < llBaseOffset.value()) {
        printf("offset must be >= baseoffset\n");
        return 1;
    }


    if (!dstFilename.empty()) {
        if (g_llStepSize)
            CopyFileSteps(srcFilename, dstFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
        else
            Copyfile(srcFilename, dstFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
    }
    else {
        if (g_llStepSize)
            StepFile(srcFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
        else
            Dumpfile(srcFilename, llBaseOffset.value(), llOffset.value(), llLength.value());
    }

    return 0;
}